

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

bool baryonyx::is_valid_solution_impl
               (raw_problem *pb,vector<signed_char,_std::allocator<signed_char>_> *variable_value)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_t e;
  size_t i;
  vector<signed_char,_std::allocator<signed_char>_> *variable_value_local;
  raw_problem *pb_local;
  
  bVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::empty(variable_value);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    details::fail_fast("Precondition","!variable_value.empty()",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                       ,"158");
  }
  sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size(variable_value);
  sVar4 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::size(&(pb->vars).names);
  if (sVar3 == sVar4) {
    sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size(variable_value);
    sVar4 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::size
                      (&(pb->vars).values);
    if (sVar3 != sVar4) {
      details::fail_fast("Precondition","variable_value.size() == pb.vars.values.size()",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                         ,"160");
    }
    e = 0;
    sVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                      (&pb->equal_constraints);
    for (; e != sVar3; e = e + 1) {
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&pb->equal_constraints,e);
      iVar2 = compute_function<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::vector<signed_char,std::allocator<signed_char>>>
                        (&pvVar5->elements,variable_value);
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&pb->equal_constraints,e);
      if (iVar2 != pvVar5->value) {
        return false;
      }
    }
    e = 0;
    sVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                      (&pb->less_constraints);
    for (; e != sVar3; e = e + 1) {
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&pb->less_constraints,e);
      iVar2 = compute_function<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::vector<signed_char,std::allocator<signed_char>>>
                        (&pvVar5->elements,variable_value);
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&pb->less_constraints,e);
      if (pvVar5->value < iVar2) {
        return false;
      }
    }
    e = 0;
    sVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                      (&pb->greater_constraints);
    while( true ) {
      if (e == sVar3) {
        return true;
      }
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&pb->greater_constraints,e);
      iVar2 = compute_function<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,std::vector<signed_char,std::allocator<signed_char>>>
                        (&pvVar5->elements,variable_value);
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&pb->greater_constraints,e);
      if (iVar2 < pvVar5->value) break;
      e = e + 1;
    }
    return false;
  }
  details::fail_fast("Precondition","variable_value.size() == pb.vars.names.size()",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                     ,"159");
}

Assistant:

static bool
is_valid_solution_impl(const raw_problem& pb,
                       const std::vector<var_value>& variable_value)
{
    bx_expects(!variable_value.empty());
    bx_expects(variable_value.size() == pb.vars.names.size());
    bx_expects(variable_value.size() == pb.vars.values.size());

    std::size_t i, e;

    for (i = 0, e = pb.equal_constraints.size(); i != e; ++i) {
        if (compute_function(pb.equal_constraints[i].elements,
                             variable_value) != pb.equal_constraints[i].value)
            return false;
    }

    for (i = 0, e = pb.less_constraints.size(); i != e; ++i) {
        if (compute_function(pb.less_constraints[i].elements, variable_value) >
            pb.less_constraints[i].value)
            return false;
    }

    for (i = 0, e = pb.greater_constraints.size(); i != e; ++i) {
        if (compute_function(pb.greater_constraints[i].elements,
                             variable_value) < pb.greater_constraints[i].value)
            return false;
    }

    return true;
}